

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_console.cpp
# Opt level: O0

void crnlib::console::add_console_output_func(console_output_func pFunc,void *pData)

{
  console_func local_30;
  scoped_mutex local_20;
  scoped_mutex lock;
  void *pData_local;
  console_output_func pFunc_local;
  
  lock.m_mutex = (mutex *)pData;
  init((EVP_PKEY_CTX *)pFunc);
  scoped_mutex::scoped_mutex(&local_20,m_pMutex);
  console_func::console_func(&local_30,pFunc,lock.m_mutex);
  vector<crnlib::console::console_func>::push_back
            ((vector<crnlib::console::console_func> *)m_output_funcs,&local_30);
  scoped_mutex::~scoped_mutex(&local_20);
  return;
}

Assistant:

void console::add_console_output_func(console_output_func pFunc, void* pData)
    {
        init();

        scoped_mutex lock(*m_pMutex);

        m_output_funcs.push_back(console_func(pFunc, pData));
    }